

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

Variable __thiscall
LiteScript::_Type_CHARACTER::Convert(_Type_CHARACTER *this,Variable *obj,Type *type)

{
  bool bVar1;
  char32_t c;
  Object *pOVar2;
  Type *in_RCX;
  uint *extraout_RDX;
  Variable VVar4;
  String local_40;
  uint *puVar3;
  
  bVar1 = Type::operator==(in_RCX,(Type *)_type_string);
  pOVar2 = Variable::operator->((Variable *)type);
  if (bVar1) {
    Memory::Create((Memory *)this,(Type *)pOVar2->memory);
    pOVar2 = Variable::operator->((Variable *)type);
    c = Character::operator_cast_to_char32_t((Character *)pOVar2->data);
    String::String(&local_40,c);
    pOVar2 = Variable::operator->((Variable *)this);
    String::operator=((String *)pOVar2->data,&local_40);
    std::__cxx11::u32string::~u32string((u32string *)&local_40);
    puVar3 = extraout_RDX;
  }
  else {
    VVar4 = Memory::Create((Memory *)this,(Type *)pOVar2->memory);
    puVar3 = VVar4.nb_ref;
  }
  VVar4.nb_ref = puVar3;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CHARACTER::Convert(const LiteScript::Variable& obj, const LiteScript::Type& type) const {
    if (type == Type::STRING) {
        Variable res = obj->memory.Create(Type::STRING);
        res->GetData<String>() = String(obj->GetData<Character>());
        return res;
    }
    else {
        return obj->memory.Create(Type::NIL);
    }
}